

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

ON_BrepFace * __thiscall
ON_Brep::NewConeFace(ON_Brep *this,ON_BrepVertex *vertex,ON_BrepEdge *edge,bool bRevEdge)

{
  int vi0;
  int iVar1;
  ON_BrepEdge *pOVar2;
  ON_BrepVertex *pOVar3;
  ON_NurbsSurface *this_00;
  ON_BrepFace *face;
  ON_BrepEdge *west_edge;
  ON_BrepEdge *east_edge;
  int iStack_c8;
  bool bRev3d [4];
  int eid [4];
  int vid [4];
  ON_NurbsSurface *srf;
  undefined1 local_70 [8];
  ON_NurbsCurve c;
  bool bRevEdge_local;
  ON_BrepEdge *edge_local;
  ON_BrepVertex *vertex_local;
  ON_Brep *this_local;
  
  c.m_cv._7_1_ = bRevEdge;
  pOVar2 = Edge(this,edge->m_edge_index);
  if (pOVar2 == edge) {
    pOVar3 = Vertex(this,vertex->m_vertex_index);
    if (pOVar3 == vertex) {
      if (edge->m_vi[0] == vertex->m_vertex_index) {
        this_local = (ON_Brep *)0x0;
      }
      else if (edge->m_vi[1] == vertex->m_vertex_index) {
        this_local = (ON_Brep *)0x0;
      }
      else {
        ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)local_70);
        iVar1 = (*(edge->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                  _vptr_ON_Object[0x3f])(0,edge,(ON_NurbsCurve *)local_70,0);
        if (iVar1 == 0) {
          this_local = (ON_Brep *)0x0;
        }
        else {
          if ((c.m_cv._7_1_ & 1) != 0) {
            ON_NurbsCurve::Reverse((ON_NurbsCurve *)local_70);
          }
          this_00 = ON_NurbsSurface::New();
          iVar1 = ON_NurbsSurface::CreateConeSurface
                            (this_00,(vertex->super_ON_Point).point,(ON_Curve *)local_70,
                             (ON_Interval *)0x0);
          if (iVar1 == 0) {
            if (this_00 != (ON_NurbsSurface *)0x0) {
              (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
            }
            this_local = (ON_Brep *)0x0;
          }
          else {
            eid[3] = edge->m_vi[(byte)~c.m_cv._7_1_ & 1];
            eid[2] = edge->m_vi[c.m_cv._7_1_ & 1];
            iVar1 = vertex->m_vertex_index;
            vi0 = vertex->m_vertex_index;
            eid[0] = -1;
            eid[1] = -1;
            _iStack_c8 = CONCAT44(0xffffffff,edge->m_edge_index);
            east_edge._4_4_ = c.m_cv._7_1_ & 0xffffff01;
            pOVar2 = FindLinearEdge(this,edge->m_vi[(byte)~c.m_cv._7_1_ & 1],iVar1);
            if (pOVar2 != (ON_BrepEdge *)0x0) {
              _iStack_c8 = CONCAT44(pOVar2->m_edge_index,iStack_c8);
              east_edge._4_2_ = CONCAT11(pOVar2->m_vi[0] == iVar1,east_edge._4_1_);
            }
            pOVar2 = FindLinearEdge(this,vi0,eid[2]);
            if (pOVar2 != (ON_BrepEdge *)0x0) {
              eid[1] = pOVar2->m_edge_index;
              east_edge._4_4_ = CONCAT13(pOVar2->m_vi[0] == eid[2],east_edge._4_3_);
            }
            this_local = (ON_Brep *)
                         NewFace(this,&this_00->super_ON_Surface,eid + 2,&iStack_c8,
                                 (bool *)((long)&east_edge + 4));
            if (this_local != (ON_Brep *)0x0) {
              SynchFaceOrientation
                        (this,(this_local->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_capacity);
            }
          }
        }
        ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)local_70);
      }
    }
    else {
      this_local = (ON_Brep *)0x0;
    }
  }
  else {
    this_local = (ON_Brep *)0x0;
  }
  return (ON_BrepFace *)this_local;
}

Assistant:

ON_BrepFace* ON_Brep::NewConeFace(
      const ON_BrepVertex& vertex,
      const ON_BrepEdge& edge,
      bool bRevEdge
      )
{
  if ( Edge( edge.m_edge_index) != &edge )
    return nullptr;
  if ( Vertex( vertex.m_vertex_index) != &vertex )
    return nullptr;
  if ( edge.m_vi[0] == vertex.m_vertex_index )
    return nullptr;
  if ( edge.m_vi[1] == vertex.m_vertex_index )
    return nullptr;
  ON_NurbsCurve c;
  if ( !edge.GetNurbForm( c ) )
    return nullptr;
  if ( bRevEdge )
    c.Reverse();
  ON_NurbsSurface* srf = ON_NurbsSurface::New();
  if ( !srf->CreateConeSurface( vertex.point, c ) )
  {
    delete srf;
    return nullptr;
  }

  // corner vertices (sw,se,ne,nw)
  int vid[4] = {-1,-1,-1,-1};
  vid[0] = edge.m_vi[bRevEdge?1:0];
  vid[1] = edge.m_vi[bRevEdge?0:1];
  vid[2] = vertex.m_vertex_index;
  vid[3] = vertex.m_vertex_index;

  // side edges (s,e,n,w)
  int eid[4] = {-1,-1,-1,-1};
  bool bRev3d[4] = {false,false,false,false};
  
  // south side
  eid[0] = edge.m_edge_index;
  bRev3d[0] = bRevEdge;
  
  // east side
  const ON_BrepEdge* east_edge = FindLinearEdge( *this, vid[1], vid[2] );
  if ( east_edge )
  {
    eid[1] = east_edge->m_edge_index;
    bRev3d[1] = (east_edge->m_vi[0] == vid[2]);
  }

  // west side
  const ON_BrepEdge* west_edge = FindLinearEdge( *this, vid[3], vid[0] );
  if ( west_edge )
  {
    eid[3] = west_edge->m_edge_index;
    bRev3d[3] = (west_edge->m_vi[0] == vid[0]);
  }

  ON_BrepFace* face = NewFace( srf, vid, eid, bRev3d );
  if ( face )
    SynchFaceOrientation( *this, face->m_face_index );
  return face;
}